

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

double trng::math::detail::Beta_I<double>(double x,double p,double q,double norm)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if ((((1.0 < x) || (x < 0.0)) || (p <= 0.0)) || (q <= 0.0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x21;
    dVar6 = NAN;
  }
  else {
    dVar8 = p + q;
    dVar9 = 1.0 - x;
    dVar5 = dVar8 * x;
    dVar6 = x;
    dVar13 = p;
    if (p < dVar5) {
      dVar6 = dVar9;
      dVar9 = x;
      dVar13 = q;
      q = p;
    }
    iVar2 = (int)(dVar9 * dVar8 + q);
    dVar7 = dVar6;
    if (iVar2 != 0) {
      dVar7 = dVar6 / dVar9;
    }
    dVar10 = (dVar7 * (q + -1.0)) / (dVar13 + 1.0);
    dVar14 = dVar10 + 1.0;
    if ((8.881784197001252e-16 < ABS(dVar10)) || (dVar14 * 8.881784197001252e-16 < ABS(dVar10))) {
      dVar11 = 1.0;
      do {
        dVar11 = dVar11 + 1.0;
        if (iVar2 < 1) {
          dVar1 = dVar8 + 1.0;
          dVar12 = dVar8;
        }
        else {
          dVar1 = dVar8;
          dVar12 = q - dVar11;
          if (iVar2 == 1) {
            dVar7 = dVar6;
          }
        }
        dVar8 = dVar1;
        dVar10 = dVar10 * ((dVar12 * dVar7) / (dVar13 + dVar11));
        dVar14 = dVar14 + dVar10;
        iVar2 = iVar2 + -1;
      } while ((8.881784197001252e-16 < ABS(dVar10)) ||
              (dVar14 * 8.881784197001252e-16 < ABS(dVar10)));
    }
    dVar6 = log(dVar6);
    dVar9 = log(dVar9);
    dVar6 = exp(dVar9 * (q + -1.0) + dVar6 * dVar13);
    dVar14 = ((dVar6 / dVar13) / norm) * dVar14;
    uVar4 = -(ulong)(p < dVar5);
    dVar6 = (double)(uVar4 & (ulong)(1.0 - dVar14) | ~uVar4 & (ulong)dVar14);
  }
  return dVar6;
}

Assistant:

TRNG_CUDA_ENABLE T Beta_I(T x, T p, T q, T norm) {
        if (p <= 0 or q <= 0 or x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::quiet_NaN();
        }
        const T eps{4 * numeric_limits<T>::epsilon()};
        T psq{p + q}, cx{1 - x};
        const bool flag{p < psq * x};
        if (flag) {
          // use  I(x, p, q) = 1 - I(1 - x, q, p)
          utility::swap(x, cx);
          utility::swap(p, q);
        }
        T term{1}, i{1}, y{1}, rx{x / cx}, temp{q - i};
        int s{static_cast<int>(q + cx * psq)};
        if (s == 0)
          rx = x;
        while (true) {
          term *= temp * rx / (p + i);
          y += term;
          temp = abs(term);
          if (temp <= eps and temp <= eps * y)
            break;
          ++i;
          --s;
          if (s >= 0) {
            temp = q - i;
            if (s == 0)
              rx = x;
          } else {
            temp = psq;
            psq++;
          }
        }
        y *= exp(p * ln(x) + (q - 1) * ln(cx)) / p / norm;
        return flag ? 1 - y : y;
      }